

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::Generate
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator> *pFVar1;
  Context *context;
  undefined8 *puVar2;
  bool bVar3;
  int iVar4;
  mapped_type *pmVar5;
  ImmutableFieldLiteGenerator *pIVar6;
  Descriptor *pDVar7;
  int i_00;
  int i_01;
  Descriptor *descriptor;
  ulong uVar8;
  ulong extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar9;
  undefined8 extraout_RDX_01;
  ImmutableMessageLiteGenerator *this_00;
  ImmutableMessageLiteGenerator *extraout_RDX_02;
  int j;
  long lVar10;
  int iVar11;
  int i_1;
  java *this_01;
  int i;
  long lVar12;
  OneofDescriptor *oneof;
  ImmutableMessageLiteGenerator *this_02;
  ImmutableMessageLiteGenerator messageGenerator;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  SubstituteArg local_240;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variables;
  string local_1e0;
  string builder_type;
  SubstituteArg local_1a0;
  string local_170;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &variables._M_t._M_impl.super__Rb_tree_header._M_header;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&messageGenerator,"static",(allocator *)&vars);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&variables,(key_type *)&messageGenerator);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)&messageGenerator);
  std::__cxx11::string::string((string *)&messageGenerator,"classname",(allocator *)&vars);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&variables,(key_type *)&messageGenerator);
  std::__cxx11::string::_M_assign((string *)pmVar5);
  std::__cxx11::string::~string((string *)&messageGenerator);
  ExtraMessageInterfaces_abi_cxx11_
            ((string *)&messageGenerator,(java *)(this->super_MessageGenerator).descriptor_,
             descriptor);
  std::__cxx11::string::string((string *)&vars,"extra_interfaces",(allocator *)&local_240);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&variables,(key_type *)&vars);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&vars);
  std::__cxx11::string::~string((string *)&messageGenerator);
  std::__cxx11::string::string((string *)&messageGenerator,"deprecation",(allocator *)&vars);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&variables,(key_type *)&messageGenerator);
  std::__cxx11::string::assign((char *)pmVar5);
  std::__cxx11::string::~string((string *)&messageGenerator);
  this_00 = this;
  WriteMessageDocComment(printer,(this->super_MessageGenerator).descriptor_);
  pDVar7 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  std::__cxx11::string::string((string *)&messageGenerator,"",(allocator *)&vars);
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar7,true,(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  builder_type._M_dataplus._M_p = (pointer)&builder_type.field_2;
  builder_type._M_string_length = 0;
  builder_type.field_2._M_local_buf[0] = '\0';
  if (*(int *)((this_00->super_MessageGenerator).descriptor_ + 0x68) < 1) {
    io::Printer::Print(printer,&variables,
                       "$deprecation$public $static$final class $classname$ extends\n    com.google.protobuf.GeneratedMessageLite<\n        $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    std::__cxx11::string::assign((char *)&builder_type);
  }
  else {
    io::Printer::Print(printer,&variables,
                       "$deprecation$public $static$final class $classname$ extends\n    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n      $classname$, $classname$.Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
                      );
    ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
              (&local_1e0,this_00->name_resolver_,(this_00->super_MessageGenerator).descriptor_);
    vars._M_t._M_impl._0_8_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
    local_240.text_ = (char *)0x0;
    local_240.size_ = -1;
    local_1a0.text_ = (char *)0x0;
    local_1a0.size_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    messageGenerator.super_MessageGenerator._vptr_MessageGenerator =
         (_func_int **)local_1e0._M_dataplus._M_p;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    messageGenerator.super_MessageGenerator.descriptor_._0_4_ =
         (undefined4)local_1e0._M_string_length;
    local_150.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_170,
               (strings *)"com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
               (char *)&messageGenerator,(SubstituteArg *)&vars,&local_240,&local_1a0,&local_60,
               &local_90,&local_c0,&local_f0,&local_120,&local_150,(SubstituteArg *)this_00);
    std::__cxx11::string::operator=((string *)&builder_type,(string *)&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  io::Printer::Indent(printer);
  GenerateConstructor(this_00,printer);
  lVar10 = 0;
  for (lVar12 = 0; pDVar7 = (this_00->super_MessageGenerator).descriptor_,
      lVar12 < *(int *)(pDVar7 + 0x58); lVar12 = lVar12 + 1) {
    EnumLiteGenerator::EnumLiteGenerator
              ((EnumLiteGenerator *)&messageGenerator,
               (EnumDescriptor *)(*(long *)(pDVar7 + 0x60) + lVar10),true,this_00->context_);
    EnumLiteGenerator::Generate((EnumLiteGenerator *)&messageGenerator,printer);
    EnumLiteGenerator::~EnumLiteGenerator((EnumLiteGenerator *)&messageGenerator);
    lVar10 = lVar10 + 0x38;
  }
  lVar10 = 0;
  for (lVar12 = 0; lVar12 < *(int *)(pDVar7 + 0x48); lVar12 = lVar12 + 1) {
    if (*(char *)(*(long *)(*(long *)(pDVar7 + 0x50) + 0x20 + lVar10) + 0x6b) == '\0') {
      ImmutableMessageLiteGenerator
                (&messageGenerator,(Descriptor *)(*(long *)(pDVar7 + 0x50) + lVar10),
                 this_00->context_);
      GenerateInterface(&messageGenerator,printer);
      Generate(&messageGenerator,printer);
      ~ImmutableMessageLiteGenerator(&messageGenerator);
      pDVar7 = (this_00->super_MessageGenerator).descriptor_;
    }
    lVar10 = lVar10 + 0xa8;
  }
  bVar3 = anon_unknown_18::GenerateHasBits(pDVar7);
  if (bVar3) {
    pFVar1 = &this_00->field_generators_;
    lVar10 = 0;
    iVar11 = 0;
    for (lVar12 = 0; pDVar7 = (this_00->super_MessageGenerator).descriptor_,
        lVar12 < *(int *)(pDVar7 + 0x2c); lVar12 = lVar12 + 1) {
      pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                         (pFVar1,(FieldDescriptor *)(*(long *)(pDVar7 + 0x30) + lVar10));
      iVar4 = (*pIVar6->_vptr_ImmutableFieldLiteGenerator[2])(pIVar6);
      iVar11 = iVar11 + iVar4;
      lVar10 = lVar10 + 0xa8;
    }
    iVar4 = (iVar11 + 0x1f) / 0x20;
    uVar8 = (long)(iVar11 + 0x1f) % 0x20 & 0xffffffff;
    this_01 = (java *)0x0;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    for (; iVar4 != (int)this_01; this_01 = (java *)(ulong)((int)this_01 + 1)) {
      GetBitFieldName_abi_cxx11_((string *)&messageGenerator,this_01,(int)uVar8);
      io::Printer::Print(printer,"private int $bit_field_name$;\n","bit_field_name",
                         (string *)&messageGenerator);
      std::__cxx11::string::~string((string *)&messageGenerator);
      uVar8 = extraout_RDX;
    }
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar10 = 0; pDVar7 = (this_00->super_MessageGenerator).descriptor_,
      lVar10 < *(int *)(pDVar7 + 0x38); lVar10 = lVar10 + 1) {
    oneof = (OneofDescriptor *)(lVar10 * 0x30 + *(long *)(pDVar7 + 0x40));
    Context::GetOneofGeneratorInfo(this_00->context_,oneof);
    std::__cxx11::string::string((string *)&messageGenerator,"oneof_name",(allocator *)&local_240);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&messageGenerator);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&messageGenerator);
    Context::GetOneofGeneratorInfo(this_00->context_,oneof);
    std::__cxx11::string::string
              ((string *)&messageGenerator,"oneof_capitalized_name",(allocator *)&local_240);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&messageGenerator);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::~string((string *)&messageGenerator);
    lVar12 = (long)oneof - *(long *)(*(long *)(oneof + 0x10) + 0x40);
    SimpleItoa_abi_cxx11_
              ((string *)&messageGenerator,(protobuf *)(lVar12 / 0x30 & 0xffffffff),
               (int)(lVar12 % 0x30));
    std::__cxx11::string::string((string *)&local_240,"oneof_index",(allocator *)&local_1a0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&local_240);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&messageGenerator);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&messageGenerator);
    io::Printer::Print(printer,&vars,
                       "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                      );
    io::Printer::Print(printer,&vars,
                       "public enum $oneof_capitalized_name$Case\n    implements com.google.protobuf.Internal.EnumLite {\n"
                      );
    io::Printer::Indent(printer);
    for (lVar12 = 0; lVar12 < *(int *)(oneof + 0x1c); lVar12 = lVar12 + 1) {
      puVar2 = *(undefined8 **)(*(long *)(oneof + 0x20) + lVar12 * 8);
      ToUpper((string *)&messageGenerator,(string *)*puVar2);
      SimpleItoa_abi_cxx11_((string *)&local_240,(protobuf *)(ulong)*(uint *)(puVar2 + 7),i_00);
      io::Printer::Print(printer,"$field_name$($field_number$),\n","field_name",
                         (string *)&messageGenerator,"field_number",(string *)&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&messageGenerator);
    }
    std::__cxx11::string::string((string *)&local_240,"oneof_name",(allocator *)&local_1a0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&local_240);
    ToUpper((string *)&messageGenerator,pmVar5);
    io::Printer::Print(printer,"$cap_oneof_name$_NOT_SET(0);\n","cap_oneof_name",
                       (string *)&messageGenerator);
    std::__cxx11::string::~string((string *)&messageGenerator);
    std::__cxx11::string::~string((string *)&local_240);
    io::Printer::Print(printer,&vars,
                       "private final int value;\nprivate $oneof_capitalized_name$Case(int value) {\n  this.value = value;\n}\n"
                      );
    io::Printer::Print(printer,&vars,
                       "/**\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $oneof_capitalized_name$Case valueOf(int value) {\n  return forNumber(value);\n}\n\npublic static $oneof_capitalized_name$Case forNumber(int value) {\n  switch (value) {\n"
                      );
    uVar9 = extraout_RDX_00;
    for (lVar12 = 0; lVar12 < *(int *)(oneof + 0x1c); lVar12 = lVar12 + 1) {
      puVar2 = *(undefined8 **)(*(long *)(oneof + 0x20) + lVar12 * 8);
      SimpleItoa_abi_cxx11_
                ((string *)&messageGenerator,(protobuf *)(ulong)*(uint *)(puVar2 + 7),(int)uVar9);
      ToUpper((string *)&local_240,(string *)*puVar2);
      io::Printer::Print(printer,"    case $field_number$: return $field_name$;\n","field_number",
                         (string *)&messageGenerator,"field_name",(string *)&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&messageGenerator);
      uVar9 = extraout_RDX_01;
    }
    std::__cxx11::string::string((string *)&local_240,"oneof_name",(allocator *)&local_1a0);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&local_240);
    ToUpper((string *)&messageGenerator,pmVar5);
    io::Printer::Print(printer,
                       "    case 0: return $cap_oneof_name$_NOT_SET;\n    default: return null;\n  }\n}\npublic int getNumber() {\n  return this.value;\n}\n"
                       ,"cap_oneof_name",(string *)&messageGenerator);
    std::__cxx11::string::~string((string *)&messageGenerator);
    std::__cxx11::string::~string((string *)&local_240);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"};\n\n");
    io::Printer::Print(printer,&vars,
                       "public $oneof_capitalized_name$Case\nget$oneof_capitalized_name$Case() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\nprivate void clear$oneof_capitalized_name$() {\n  $oneof_name$Case_ = 0;\n  $oneof_name$_ = null;\n}\n\n"
                      );
  }
  pFVar1 = &this_00->field_generators_;
  lVar10 = 0;
  this_02 = this_00;
  for (lVar12 = 0; lVar12 < *(int *)(pDVar7 + 0x2c); lVar12 = lVar12 + 1) {
    FieldConstantName_abi_cxx11_
              ((string *)&messageGenerator,(java *)(*(long *)(pDVar7 + 0x30) + lVar10),
               (FieldDescriptor *)this_00);
    SimpleItoa_abi_cxx11_
              ((string *)&local_240,
               (protobuf *)
               (ulong)*(uint *)(*(long *)((this_02->super_MessageGenerator).descriptor_ + 0x30) +
                                0x38 + lVar10),i_01);
    io::Printer::Print(printer,"public static final int $constant_name$ = $number$;\n",
                       "constant_name",(string *)&messageGenerator,"number",(string *)&local_240);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&messageGenerator);
    pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::get
                       (pFVar1,(FieldDescriptor *)
                               (*(long *)((this_02->super_MessageGenerator).descriptor_ + 0x30) +
                               lVar10));
    (*pIVar6->_vptr_ImmutableFieldLiteGenerator[5])(pIVar6,printer);
    io::Printer::Print(printer,"\n");
    pDVar7 = (this_02->super_MessageGenerator).descriptor_;
    lVar10 = lVar10 + 0xa8;
    this_00 = extraout_RDX_02;
  }
  GenerateMessageSerializationMethods(this_02,printer);
  GenerateParseFromMethods(this_02,printer);
  GenerateBuilder(this_02,printer);
  bVar3 = HasRequiredFields((this_02->super_MessageGenerator).descriptor_);
  if (bVar3) {
    io::Printer::Print(printer,"private byte memoizedIsInitialized = -1;\n");
  }
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this_02->name_resolver_,
             (this_02->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "@java.lang.SuppressWarnings({\"unchecked\", \"fallthrough\"})\nprotected final Object dynamicMethod(\n    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n    Object arg0, Object arg1) {\n  switch (method) {\n    case NEW_MUTABLE_INSTANCE: {\n      return new $classname$();\n    }\n"
                     ,"classname",(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  io::Printer::Indent(printer);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"case IS_INITIALIZED: {\n");
  io::Printer::Indent(printer);
  GenerateDynamicMethodIsInitialized(this_02,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\ncase MAKE_IMMUTABLE: {\n");
  io::Printer::Indent(printer);
  GenerateDynamicMethodMakeImmutable(this_02,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\ncase NEW_BUILDER: {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"return new Builder();\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\ncase VISIT: {\n");
  io::Printer::Indent(printer);
  GenerateDynamicMethodVisit(this_02,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\ncase MERGE_FROM_STREAM: {\n");
  io::Printer::Indent(printer);
  GenerateDynamicMethodMergeFromStream(this_02,printer);
  io::Printer::Outdent(printer);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this_02->name_resolver_,
             (this_02->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "}\n// fall through\ncase GET_DEFAULT_INSTANCE: {\n  return DEFAULT_INSTANCE;\n}\ncase GET_PARSER: {\n  if (PARSER == null) {    synchronized ($classname$.class) {\n      if (PARSER == null) {\n        PARSER = new DefaultInstanceBasedParser(DEFAULT_INSTANCE);\n      }\n    }\n  }\n  return PARSER;\n}\n"
                     ,"classname",(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this_02->name_resolver_,
             (this_02->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,"  }\n  throw new UnsupportedOperationException();\n}\n\n","classname",
                     (string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  io::Printer::Print(printer,"\n// @@protoc_insertion_point(class_scope:$full_name$)\n","full_name",
                     *(string **)((this_02->super_MessageGenerator).descriptor_ + 8));
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this_02->name_resolver_,
             (this_02->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,"private static final $classname$ DEFAULT_INSTANCE;\n","classname",
                     (string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  io::Printer::Print(printer,
                     "static {\n  DEFAULT_INSTANCE = new $classname$();\n  DEFAULT_INSTANCE.makeImmutable();\n}\n\n"
                     ,"classname",*(string **)(this_02->super_MessageGenerator).descriptor_);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            ((string *)&messageGenerator,this_02->name_resolver_,
             (this_02->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "public static $classname$ getDefaultInstance() {\n  return DEFAULT_INSTANCE;\n}\n\n"
                     ,"classname",(string *)&messageGenerator);
  std::__cxx11::string::~string((string *)&messageGenerator);
  GenerateParser(this_02,printer);
  lVar10 = 0;
  for (lVar12 = 0; pDVar7 = (this_02->super_MessageGenerator).descriptor_,
      lVar12 < *(int *)(pDVar7 + 0x78); lVar12 = lVar12 + 1) {
    ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
              ((ImmutableExtensionLiteGenerator *)&messageGenerator,
               (FieldDescriptor *)(*(long *)(pDVar7 + 0x80) + lVar10),this_02->context_);
    ImmutableExtensionLiteGenerator::Generate
              ((ImmutableExtensionLiteGenerator *)&messageGenerator,printer);
    ImmutableExtensionLiteGenerator::~ImmutableExtensionLiteGenerator
              ((ImmutableExtensionLiteGenerator *)&messageGenerator);
    lVar10 = lVar10 + 0xa8;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  std::__cxx11::string::~string((string *)&builder_type);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&variables._M_t);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::Generate(io::Printer* printer) {
  bool is_own_file = IsOwnFile(descriptor_, /* immutable = */ true);

  std::map<string, string> variables;
  variables["static"] = is_own_file ? " " : " static ";
  variables["classname"] = descriptor_->name();
  variables["extra_interfaces"] = ExtraMessageInterfaces(descriptor_);
  variables["deprecation"] = descriptor_->options().deprecated()
      ? "@java.lang.Deprecated " : "";

  WriteMessageDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true);


  // The builder_type stores the super type name of the nested Builder class.
  string builder_type;
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(variables,
      "$deprecation$public $static$final class $classname$ extends\n"
      "    com.google.protobuf.GeneratedMessageLite.ExtendableMessage<\n"
      "      $classname$, $classname$.Builder> implements\n"
      "    $extra_interfaces$\n"
      "    $classname$OrBuilder {\n");
    builder_type = strings::Substitute(
        "com.google.protobuf.GeneratedMessageLite.ExtendableBuilder<$0, ?>",
        name_resolver_->GetImmutableClassName(descriptor_));
  } else {
    printer->Print(variables,
        "$deprecation$public $static$final class $classname$ extends\n"
        "    com.google.protobuf.GeneratedMessageLite<\n"
        "        $classname$, $classname$.Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n");

    builder_type = "com.google.protobuf.GeneratedMessageLite.Builder";
  }
  printer->Indent();

  GenerateConstructor(printer);

  // Nested types
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    EnumLiteGenerator(descriptor_->enum_type(i), true, context_)
        .Generate(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // Don't generate Java classes for map entry messages.
    if (IsMapEntry(descriptor_->nested_type(i))) continue;
    ImmutableMessageLiteGenerator messageGenerator(
        descriptor_->nested_type(i), context_);
    messageGenerator.GenerateInterface(printer);
    messageGenerator.Generate(printer);
  }

  if (GenerateHasBits(descriptor_)) {
    // Integers for bit fields.
    int totalBits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      totalBits += field_generators_.get(descriptor_->field(i))
          .GetNumBitsForMessage();
    }
    int totalInts = (totalBits + 31) / 32;
    for (int i = 0; i < totalInts; i++) {
      printer->Print("private int $bit_field_name$;\n",
        "bit_field_name", GetBitFieldName(i));
    }
  }

  // oneof
  std::map<string, string> vars;
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] = context_->GetOneofGeneratorInfo(
        oneof)->capitalized_name;
    vars["oneof_index"] = SimpleItoa(oneof->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
      "private int $oneof_name$Case_ = 0;\n"
      "private java.lang.Object $oneof_name$_;\n");
    // OneofCase enum
    printer->Print(vars,
      "public enum $oneof_capitalized_name$Case\n"
      "    implements com.google.protobuf.Internal.EnumLite {\n");
    printer->Indent();
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print(
        "$field_name$($field_number$),\n",
        "field_name",
        ToUpper(field->name()),
        "field_number",
        SimpleItoa(field->number()));
    }
    printer->Print(
      "$cap_oneof_name$_NOT_SET(0);\n",
      "cap_oneof_name",
      ToUpper(vars["oneof_name"]));
    printer->Print(vars,
      "private final int value;\n"
      "private $oneof_capitalized_name$Case(int value) {\n"
      "  this.value = value;\n"
      "}\n");
    printer->Print(vars,
      "/**\n"
      " * @deprecated Use {@link #forNumber(int)} instead.\n"
      " */\n"
      "@java.lang.Deprecated\n"
      "public static $oneof_capitalized_name$Case valueOf(int value) {\n"
      "  return forNumber(value);\n"
      "}\n"
      "\n"
      "public static $oneof_capitalized_name$Case forNumber(int value) {\n"
      "  switch (value) {\n");
    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      printer->Print(
        "    case $field_number$: return $field_name$;\n",
        "field_number",
        SimpleItoa(field->number()),
        "field_name",
        ToUpper(field->name()));
    }
    printer->Print(
      "    case 0: return $cap_oneof_name$_NOT_SET;\n"
      "    default: return null;\n"
      "  }\n"
      "}\n"
      "public int getNumber() {\n"
      "  return this.value;\n"
      "}\n",
      "cap_oneof_name", ToUpper(vars["oneof_name"]));
    printer->Outdent();
    printer->Print("};\n\n");
    // oneofCase()
    printer->Print(vars,
      "public $oneof_capitalized_name$Case\n"
      "get$oneof_capitalized_name$Case() {\n"
      "  return $oneof_capitalized_name$Case.forNumber(\n"
      "      $oneof_name$Case_);\n"
      "}\n"
      "\n"
      "private void clear$oneof_capitalized_name$() {\n"
      "  $oneof_name$Case_ = 0;\n"
      "  $oneof_name$_ = null;\n"
      "}\n"
      "\n");
  }

  // Fields
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("public static final int $constant_name$ = $number$;\n",
      "constant_name", FieldConstantName(descriptor_->field(i)),
      "number", SimpleItoa(descriptor_->field(i)->number()));
    field_generators_.get(descriptor_->field(i)).GenerateMembers(printer);
    printer->Print("\n");
  }

  GenerateMessageSerializationMethods(printer);

  GenerateParseFromMethods(printer);
  GenerateBuilder(printer);

  if (HasRequiredFields(descriptor_)) {
    // Memoizes whether the protocol buffer is fully initialized (has all
    // required fields). -1 means not yet computed. 0 means false and 1 means
    // true.
    printer->Print(
      "private byte memoizedIsInitialized = -1;\n");
  }

  printer->Print(
    "@java.lang.SuppressWarnings({\"unchecked\", \"fallthrough\"})\n"
    "protected final Object dynamicMethod(\n"
    "    com.google.protobuf.GeneratedMessageLite.MethodToInvoke method,\n"
    "    Object arg0, Object arg1) {\n"
    "  switch (method) {\n"
    "    case NEW_MUTABLE_INSTANCE: {\n"
    "      return new $classname$();\n"
    "    }\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Indent();
  printer->Indent();

  printer->Print(
    "case IS_INITIALIZED: {\n");
  printer->Indent();
  GenerateDynamicMethodIsInitialized(printer);
  printer->Outdent();

  printer->Print(
    "}\n"
    "case MAKE_IMMUTABLE: {\n");

  printer->Indent();
  GenerateDynamicMethodMakeImmutable(printer);
  printer->Outdent();

  printer->Print(
    "}\n"
    "case NEW_BUILDER: {\n");

  printer->Indent();
  GenerateDynamicMethodNewBuilder(printer);
  printer->Outdent();

  printer->Print(
    "}\n"
    "case VISIT: {\n");

  printer->Indent();
  GenerateDynamicMethodVisit(printer);
  printer->Outdent();

  printer->Print(
    "}\n"
    "case MERGE_FROM_STREAM: {\n");

  printer->Indent();
  GenerateDynamicMethodMergeFromStream(printer);
  printer->Outdent();

  printer->Print(
    "}\n"
    "// fall through\n"
    "case GET_DEFAULT_INSTANCE: {\n"
    "  return DEFAULT_INSTANCE;\n"
    "}\n"
    "case GET_PARSER: {\n"
    // Generally one would use the lazy initialization holder pattern for
    // manipulating static fields but that has exceptional cost on Android as
    // it will generate an extra class for every message. Instead, use the
    // double-check locking pattern which works just as well.
    "  if (PARSER == null) {"
    "    synchronized ($classname$.class) {\n"
    "      if (PARSER == null) {\n"
    "        PARSER = new DefaultInstanceBasedParser(DEFAULT_INSTANCE);\n"
    "      }\n"
    "    }\n"
    "  }\n"
    "  return PARSER;\n"
    "}\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Outdent();
  printer->Outdent();

  printer->Print(
    "  }\n"
    "  throw new UnsupportedOperationException();\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(class_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());


  // Carefully initialize the default instance in such a way that it doesn't
  // conflict with other initialization.
  printer->Print(
    "private static final $classname$ DEFAULT_INSTANCE;\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
    "static {\n"
    "  DEFAULT_INSTANCE = new $classname$();\n"
    "  DEFAULT_INSTANCE.makeImmutable();\n"
    "}\n"
    "\n",
    "classname", descriptor_->name());
  printer->Print(
      "public static $classname$ getDefaultInstance() {\n"
      "  return DEFAULT_INSTANCE;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  GenerateParser(printer);

  // Extensions must be declared after the DEFAULT_INSTANCE is initialized
  // because the DEFAULT_INSTANCE is used by the extension to lazily retrieve
  // the outer class's FileDescriptor.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionLiteGenerator(descriptor_->extension(i), context_)
        .Generate(printer);
  }

  printer->Outdent();
  printer->Print("}\n\n");
}